

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O1

void __thiscall FFTAnalyzer::CheckInitialized(FFTAnalyzer *this)

{
  int iVar1;
  uint uVar2;
  float *pfVar3;
  UnityComplexNumber *pUVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  
  if (this->window != (float *)0x0) {
    return;
  }
  iVar1 = this->spectrumSize;
  lVar5 = (long)iVar1;
  uVar7 = lVar5 * 4;
  if (lVar5 < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  uVar6 = lVar5 * 8;
  if (lVar5 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pfVar3 = (float *)operator_new__(uVar7);
  this->window = pfVar3;
  pfVar3 = (float *)operator_new__(uVar7);
  this->ibuffer = pfVar3;
  pfVar3 = (float *)operator_new__(uVar7);
  uVar7 = (long)(iVar1 / 2) << 2;
  this->obuffer = pfVar3;
  if (lVar5 < -1) {
    uVar7 = 0xffffffffffffffff;
  }
  pfVar3 = (float *)operator_new__(uVar7);
  this->ispec1 = pfVar3;
  pfVar3 = (float *)operator_new__(uVar7);
  this->ispec2 = pfVar3;
  pfVar3 = (float *)operator_new__(uVar7);
  this->ospec1 = pfVar3;
  pfVar3 = (float *)operator_new__(uVar7);
  this->ospec2 = pfVar3;
  pUVar4 = (UnityComplexNumber *)operator_new__(uVar6);
  this->cspec = pUVar4;
  uVar2 = this->spectrumSize;
  uVar7 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    lVar5 = 0;
    do {
      fVar8 = cosf((3.1415927 / (float)(int)uVar7) * (float)(int)lVar5);
      this->window[lVar5] = fVar8 * -0.46 + 0.54;
      lVar5 = lVar5 + 1;
      uVar2 = this->spectrumSize;
      uVar7 = (ulong)(int)uVar2;
    } while (lVar5 < (long)uVar7);
  }
  memset(this->ibuffer,0,(long)(int)uVar2 << 2);
  memset(this->obuffer,0,(long)this->spectrumSize << 2);
  memset(this->ispec1,0,(long)(this->spectrumSize / 2) << 2);
  memset(this->ispec2,0,(long)(this->spectrumSize / 2) << 2);
  memset(this->ospec1,0,(long)(this->spectrumSize / 2) << 2);
  memset(this->ospec2,0,(long)(this->spectrumSize / 2) << 2);
  memset(this->cspec,0,(long)this->spectrumSize << 3);
  return;
}

Assistant:

void FFTAnalyzer::CheckInitialized()
{
    if (window == NULL)
    {
        window = new float[spectrumSize];
        ibuffer = new float[spectrumSize];
        obuffer = new float[spectrumSize];
        ispec1 = new float[spectrumSize / 2];
        ispec2 = new float[spectrumSize / 2];
        ospec1 = new float[spectrumSize / 2];
        ospec2 = new float[spectrumSize / 2];
        cspec = new UnityComplexNumber[spectrumSize];
        for (int n = 0; n < spectrumSize; n++)
            window[n] = 0.54f - 0.46f * cosf(n * (kPI / (float)spectrumSize));
        memset(ibuffer, 0, sizeof(float) * spectrumSize);
        memset(obuffer, 0, sizeof(float) * spectrumSize);
        memset(ispec1, 0, sizeof(float) * (spectrumSize / 2));
        memset(ispec2, 0, sizeof(float) * (spectrumSize / 2));
        memset(ospec1, 0, sizeof(float) * (spectrumSize / 2));
        memset(ospec2, 0, sizeof(float) * (spectrumSize / 2));
        memset(cspec, 0, sizeof(UnityComplexNumber) * spectrumSize);
    }
}